

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

void duckdb::RtrimFun::GetFunctions(void)

{
  ScalarFunctionSet *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_371;
  _Function_base local_370;
  code *local_358;
  _Function_base local_350;
  code *local_338;
  LogicalType local_330 [24];
  LogicalType local_318 [24];
  LogicalType local_300 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e8;
  LogicalType local_2d0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2b8;
  LogicalType local_2a0 [24];
  LogicalType local_288 [24];
  ScalarFunction local_270;
  ScalarFunction local_148;
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_330,VARCHAR);
  __l._M_len = 1;
  __l._M_array = local_330;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2b8,__l,&local_371);
  duckdb::LogicalType::LogicalType(local_2d0,VARCHAR);
  local_350._M_functor._8_8_ = 0;
  local_350._M_functor._M_unused._M_object = UnaryTrimFunction<false,true>;
  local_338 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_350._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_288,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_148,&local_2b8,local_2d0,&local_350,0,0,0,0,local_288,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_148);
  ScalarFunction::~ScalarFunction(&local_148);
  duckdb::LogicalType::~LogicalType(local_288);
  std::_Function_base::~_Function_base(&local_350);
  duckdb::LogicalType::~LogicalType(local_2d0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2b8);
  duckdb::LogicalType::~LogicalType(local_330);
  duckdb::LogicalType::LogicalType(local_330,VARCHAR);
  duckdb::LogicalType::LogicalType(local_318,VARCHAR);
  __l_00._M_len = 2;
  __l_00._M_array = local_330;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2e8,__l_00,&local_371);
  duckdb::LogicalType::LogicalType(local_300,VARCHAR);
  local_370._M_functor._8_8_ = 0;
  local_370._M_functor._M_unused._M_object = BinaryTrimFunction<false,true>;
  local_358 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_370._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_2a0,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_270,&local_2e8,local_300,&local_370,0,0,0,0,local_2a0,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_270);
  ScalarFunction::~ScalarFunction(&local_270);
  duckdb::LogicalType::~LogicalType(local_2a0);
  std::_Function_base::~_Function_base(&local_370);
  duckdb::LogicalType::~LogicalType(local_300);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e8);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_330 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

ScalarFunctionSet RtrimFun::GetFunctions() {
	ScalarFunctionSet rtrim;
	rtrim.AddFunction(ScalarFunction({LogicalType::VARCHAR}, LogicalType::VARCHAR, UnaryTrimFunction<false, true>));

	rtrim.AddFunction(ScalarFunction({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                                 BinaryTrimFunction<false, true>));
	return rtrim;
}